

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp5::groebnerRow11_10000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  lVar28 = (long)targetRow;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x134];
  auVar27._8_8_ = 0x8000000000000000;
  auVar27._0_8_ = 0x8000000000000000;
  auVar29 = vxorpd_avx512vl(auVar30,auVar27);
  auVar31._0_8_ =
       auVar29._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x6eb];
  auVar31._8_8_ = auVar29._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x134] = 0.0;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x717];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x160];
  auVar29 = vfmadd213sd_fma(auVar32,auVar31,auVar29);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x160] = auVar29._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x743];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x18c];
  auVar29 = vfmadd213sd_fma(auVar33,auVar31,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x18c] = auVar29._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x76f];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x1b8];
  auVar29 = vfmadd213sd_fma(auVar34,auVar31,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x1b8] = auVar29._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8a3];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x2ec];
  auVar29 = vfmadd213sd_fma(auVar35,auVar31,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x2ec] = auVar29._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8cf];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x318];
  auVar29 = vfmadd213sd_fma(auVar36,auVar31,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x318] = auVar29._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8fb];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x344];
  auVar29 = vfmadd213sd_fma(auVar37,auVar31,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x344] = auVar29._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x927];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x370];
  auVar29 = vfmadd213sd_fma(auVar38,auVar31,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x370] = auVar29._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x953];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x39c];
  auVar29 = vfmadd213sd_fma(auVar39,auVar31,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x39c] = auVar29._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x97f];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x3c8];
  auVar29 = vfmadd213sd_fma(auVar40,auVar31,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x3c8] = auVar29._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9ab];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar28 + 0x3f4];
  auVar29 = vfmadd213sd_fma(auVar41,auVar31,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x3f4] = auVar29._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9d7];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x420];
  auVar29 = vfmadd213sd_fma(auVar42,auVar31,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x420] = auVar29._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa03];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x44c];
  auVar29 = vfmadd213sd_fma(auVar43,auVar31,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x44c] = auVar29._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb37];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x898];
  auVar29 = vfmadd213sd_fma(auVar44,auVar31,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x898] = auVar29._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb63];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x8c4];
  auVar29 = vfmadd213sd_fma(auVar45,auVar31,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x8c4] = auVar29._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb8f];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x8f0];
  auVar29 = vfmadd213sd_fma(auVar46,auVar31,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x8f0] = auVar29._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbbb];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x91c];
  auVar29 = vfmadd213sd_fma(auVar47,auVar31,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x91c] = auVar29._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe7];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x948];
  auVar29 = vfmadd213sd_fma(auVar48,auVar31,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x948] = auVar29._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc13];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x974];
  auVar29 = vfmadd213sd_fma(auVar49,auVar31,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x974] = auVar29._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3f];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x9a0];
  auVar29 = vfmadd213sd_fma(auVar50,auVar31,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x9a0] = auVar29._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc6b];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x9cc];
  auVar29 = vfmadd213sd_fma(auVar51,auVar31,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x9cc] = auVar29._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc97];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0x9f8];
  auVar29 = vfmadd213sd_fma(auVar52,auVar31,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0x9f8] = auVar29._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcc3];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0xbdc];
  auVar29 = vfmadd213sd_fma(auVar53,auVar31,auVar21);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0xbdc] = auVar29._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcef];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0xc08];
  auVar29 = vfmadd213sd_fma(auVar54,auVar31,auVar22);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0xc08] = auVar29._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd1b];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0xc34];
  auVar29 = vfmadd213sd_fma(auVar55,auVar31,auVar23);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0xc34] = auVar29._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd47];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0xc60];
  auVar29 = vfmadd213sd_fma(auVar56,auVar31,auVar24);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0xc60] = auVar29._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd73];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0xc8c];
  auVar29 = vfmadd213sd_fma(auVar57,auVar31,auVar25);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0xc8c] = auVar29._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd9f];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar28 + 0xd68];
  auVar29 = vfmadd213sd_fma(auVar58,auVar31,auVar26);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar28 + 0xd68] = auVar29._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow11_10000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,7) / groebnerMatrix(11,40);
  groebnerMatrix(targetRow,7) = 0.0;
  groebnerMatrix(targetRow,8) -= factor * groebnerMatrix(11,41);
  groebnerMatrix(targetRow,9) -= factor * groebnerMatrix(11,42);
  groebnerMatrix(targetRow,10) -= factor * groebnerMatrix(11,43);
  groebnerMatrix(targetRow,17) -= factor * groebnerMatrix(11,50);
  groebnerMatrix(targetRow,18) -= factor * groebnerMatrix(11,51);
  groebnerMatrix(targetRow,19) -= factor * groebnerMatrix(11,52);
  groebnerMatrix(targetRow,20) -= factor * groebnerMatrix(11,53);
  groebnerMatrix(targetRow,21) -= factor * groebnerMatrix(11,54);
  groebnerMatrix(targetRow,22) -= factor * groebnerMatrix(11,55);
  groebnerMatrix(targetRow,23) -= factor * groebnerMatrix(11,56);
  groebnerMatrix(targetRow,24) -= factor * groebnerMatrix(11,57);
  groebnerMatrix(targetRow,25) -= factor * groebnerMatrix(11,58);
  groebnerMatrix(targetRow,50) -= factor * groebnerMatrix(11,65);
  groebnerMatrix(targetRow,51) -= factor * groebnerMatrix(11,66);
  groebnerMatrix(targetRow,52) -= factor * groebnerMatrix(11,67);
  groebnerMatrix(targetRow,53) -= factor * groebnerMatrix(11,68);
  groebnerMatrix(targetRow,54) -= factor * groebnerMatrix(11,69);
  groebnerMatrix(targetRow,55) -= factor * groebnerMatrix(11,70);
  groebnerMatrix(targetRow,56) -= factor * groebnerMatrix(11,71);
  groebnerMatrix(targetRow,57) -= factor * groebnerMatrix(11,72);
  groebnerMatrix(targetRow,58) -= factor * groebnerMatrix(11,73);
  groebnerMatrix(targetRow,69) -= factor * groebnerMatrix(11,74);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(11,75);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(11,76);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(11,77);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(11,78);
  groebnerMatrix(targetRow,78) -= factor * groebnerMatrix(11,79);
}